

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

HighsCDouble __thiscall
HighsLp::objectiveCDoubleValue(HighsLp *this,vector<double,_std::allocator<double>_> *solution)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  HighsCDouble HVar7;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)this->num_col_;
  if (this->num_col_ < 1) {
    uVar1 = uVar2;
  }
  dVar4 = 0.0;
  dVar3 = this->offset_;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar5 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2] *
            (solution->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar2];
    dVar6 = dVar3 + dVar5;
    dVar4 = dVar4 + (dVar3 - (dVar6 - dVar5)) + (dVar5 - (dVar6 - (dVar6 - dVar5)));
    dVar3 = dVar6;
  }
  HVar7.lo = dVar4;
  HVar7.hi = dVar3;
  return HVar7;
}

Assistant:

HighsCDouble HighsLp::objectiveCDoubleValue(
    const std::vector<double>& solution) const {
  assert((int)solution.size() >= this->num_col_);
  HighsCDouble objective_function_value = this->offset_;
  for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
    objective_function_value += this->col_cost_[iCol] * solution[iCol];
  return objective_function_value;
}